

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall cmCTestTestHandler::GenerateXML(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  char *pcVar3;
  cmXMLWriter xml;
  cmGeneratedFileStream xmlfile;
  long *local_418;
  long local_408 [2];
  undefined1 local_3f8 [376];
  cmGeneratedFileStream local_280;
  
  bVar2 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream(&local_280,None);
    pcVar3 = "Test";
    if (this->MemCheck != false) {
      pcVar3 = "DynamicAnalysis";
    }
    bVar2 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,(uint)this->MemCheck * 2 + PartTest,pcVar3
                       ,&local_280);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"Cannot create ",0xe);
      pcVar3 = "testing";
      if ((ulong)this->MemCheck != 0) {
        pcVar3 = "memory check";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f8,pcVar3,(ulong)this->MemCheck * 5 + 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," XML file",9);
      std::ios::widen((char)(ostream *)local_3f8 +
                      (char)*(undefined8 *)&((ostream *)(local_3f8._0_8_ + -0x110))->field_0xf8);
      std::ostream::put((char)local_3f8);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x2d7,(char *)local_418,false);
      goto LAB_0020cd25;
    }
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_3f8,(ostream *)&local_280,0);
    (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[9])(this);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_3f8);
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_280);
  }
  if (this->MemCheck != true) {
    return true;
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&local_280,None);
  bVar2 = cmCTestGenericHandler::StartResultingXML
                    (&this->super_cmCTestGenericHandler,PartTest,"DynamicAnalysis-Test",&local_280);
  if (bVar2) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_3f8,(ostream *)&local_280,0);
    GenerateCTestXML(this,(cmXMLWriter *)local_3f8);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_3f8);
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_280);
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"Cannot create testing XML file",0x1e);
  std::ios::widen((char)(ostream *)local_3f8 +
                  (char)*(undefined8 *)&((ostream *)(local_3f8._0_8_ + -0x110))->field_0xf8);
  std::ostream::put((char)local_3f8);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x2e4,(char *)local_418,false);
LAB_0020cd25:
  if (local_418 != local_408) {
    operator_delete(local_418,local_408[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
  std::ios_base::~ios_base((ios_base *)(local_3f8 + 0x70));
  this->LogFile = (ostream *)0x0;
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_280);
  return false;
}

Assistant:

bool cmCTestTestHandler::GenerateXML()
{
  if (this->CTest->GetProduceXML()) {
    cmGeneratedFileStream xmlfile;
    if (!this->StartResultingXML(
          (this->MemCheck ? cmCTest::PartMemCheck : cmCTest::PartTest),
          (this->MemCheck ? "DynamicAnalysis" : "Test"), xmlfile)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot create "
                   << (this->MemCheck ? "memory check" : "testing")
                   << " XML file" << std::endl);
      this->LogFile = nullptr;
      return false;
    }
    cmXMLWriter xml(xmlfile);
    this->GenerateCTestXML(xml);
  }

  if (this->MemCheck) {
    cmGeneratedFileStream xmlfile;
    if (!this->StartResultingXML(cmCTest::PartTest, "DynamicAnalysis-Test",
                                 xmlfile)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot create testing XML file" << std::endl);
      this->LogFile = nullptr;
      return false;
    }
    cmXMLWriter xml(xmlfile);
    // Explicitly call this class' `GenerateCTestXML` method to make `Test.xml`
    // as well.
    this->cmCTestTestHandler::GenerateCTestXML(xml);
  }

  return true;
}